

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O1

void combine_iteration_histograms
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *iteration_histograms_per_thread,
               vector<int,_std::allocator<int>_> *combined_iterations_histogram)

{
  pointer pvVar1;
  void *__src;
  int *piVar2;
  int *piVar3;
  pointer pvVar4;
  size_t __n;
  int *piVar5;
  int *piVar6;
  
  pvVar1 = (iteration_histograms_per_thread->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __src = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start;
  __n = (long)*(pointer *)
               ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data + 8) - (long)__src;
  if (__n != 0) {
    memmove((combined_iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start,__src,__n);
  }
  pvVar1 = (iteration_histograms_per_thread->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar4 = (iteration_histograms_per_thread->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 1;
  if (pvVar4 != pvVar1) {
    piVar2 = (combined_iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar3 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      piVar6 = piVar2;
      for (piVar5 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start; piVar5 != piVar3; piVar5 = piVar5 + 1) {
        *piVar6 = *piVar6 + *piVar5;
        piVar6 = piVar6 + 1;
      }
      pvVar4 = pvVar4 + 1;
    } while (pvVar4 != pvVar1);
  }
  return;
}

Assistant:

void combine_iteration_histograms(const std::vector<std::vector<int>>& iteration_histograms_per_thread, std::vector<int>& combined_iterations_histogram)
{
    std::copy(iteration_histograms_per_thread.front().cbegin(), iteration_histograms_per_thread.front().cend(), combined_iterations_histogram.begin());

    std::for_each(std::next(iteration_histograms_per_thread.cbegin()), iteration_histograms_per_thread.cend(), [&](auto& hist) {
        std::transform(hist.cbegin(), hist.cend(), combined_iterations_histogram.cbegin(), combined_iterations_histogram.begin(), std::plus<>{});
    });
}